

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.cc
# Opt level: O1

Status * __thiscall
draco::PlyReader::Read(Status *__return_storage_ptr__,PlyReader *this,DecoderBuffer *buffer)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PlyReader *this_00;
  string format;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  string value;
  string version;
  long *local_d0;
  long local_c8;
  long local_c0 [2];
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  undefined1 *local_50;
  _Base_ptr local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  bVar2 = parser::ParseString(buffer,&local_70);
  if ((bVar2) && (iVar3 = std::__cxx11::string::compare((char *)&local_70), iVar3 == 0)) {
    parser::SkipLine(buffer);
    this_00 = (PlyReader *)&local_70;
    parser::ParseLine(buffer,(string *)this_00);
    local_a8 = 0;
    local_a0 = 0;
    local_48 = (_Base_ptr)0x0;
    local_40 = 0;
    local_b0 = &local_a0;
    local_50 = &local_40;
    SplitWords(&local_88,this_00,&local_70);
    if (((ulong)((long)local_88.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_88.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) < 0x41) ||
       (iVar3 = std::__cxx11::string::compare
                          ((char *)local_88.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start), iVar3 != 0)) {
      local_d0 = local_c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_d0,"Missing or wrong format line","");
      __return_storage_ptr__->code_ = INVALID_PARAMETER;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->error_msg_,local_d0,local_c8 + (long)local_d0);
LAB_0011f2fc:
      if (local_d0 != local_c0) {
        operator_delete(local_d0,local_c0[0] + 1);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_b0);
      std::__cxx11::string::_M_assign((string *)&local_50);
      iVar3 = std::__cxx11::string::compare((char *)&local_50);
      if (iVar3 != 0) {
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,"Unsupported PLY version","");
        __return_storage_ptr__->code_ = UNSUPPORTED_VERSION;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,local_d0,local_c8 + (long)local_d0)
        ;
        goto LAB_0011f2fc;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar3 == 0) {
        local_d0 = local_c0;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_d0,
                   "Unsupported format. Currently we support only ascii and binary_little_endian format."
                   ,"");
        __return_storage_ptr__->code_ = UNSUPPORTED_VERSION;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->error_msg_).field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&__return_storage_ptr__->error_msg_,local_d0,local_c8 + (long)local_d0)
        ;
        goto LAB_0011f2fc;
      }
      iVar3 = std::__cxx11::string::compare((char *)&local_b0);
      this->format_ = (uint)(iVar3 == 0);
      ParseHeader(__return_storage_ptr__,this,buffer);
      if (__return_storage_ptr__->code_ == OK) {
        pcVar1 = (__return_storage_ptr__->error_msg_)._M_dataplus._M_p;
        local_90 = &(__return_storage_ptr__->error_msg_).field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != local_90) {
          operator_delete(pcVar1,local_90->_M_allocated_capacity + 1);
        }
        bVar2 = ParsePropertiesData(this,buffer);
        if (!bVar2) {
          local_d0 = local_c0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"Couldn\'t parse properties","");
          __return_storage_ptr__->code_ = INVALID_PARAMETER;
          (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&__return_storage_ptr__->error_msg_,local_d0,
                     local_c8 + (long)local_d0);
          goto LAB_0011f2fc;
        }
        __return_storage_ptr__->code_ = OK;
        (__return_storage_ptr__->error_msg_)._M_dataplus._M_p = (pointer)local_90;
        (__return_storage_ptr__->error_msg_)._M_string_length = 0;
        (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_88);
    if (local_50 != &local_40) {
      operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
    }
    if (local_b0 == &local_a0) goto LAB_0011f21a;
  }
  else {
    local_b0 = &local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"Not a valid ply file","");
    __return_storage_ptr__->code_ = INVALID_PARAMETER;
    (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->error_msg_).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->error_msg_,local_b0,local_b0 + local_a8);
    if (local_b0 == &local_a0) goto LAB_0011f21a;
  }
  operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
LAB_0011f21a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Status PlyReader::Read(DecoderBuffer *buffer) {
  std::string value;
  // The first line needs to by "ply".
  if (!parser::ParseString(buffer, &value) || value != "ply") {
    return Status(Status::INVALID_PARAMETER, "Not a valid ply file");
  }
  parser::SkipLine(buffer);

  // The second line needs to be the format of the ply file.
  parser::ParseLine(buffer, &value);
  std::string format, version;
  const std::vector<std::string> words = SplitWords(value);
  if (words.size() >= 3 && words[0] == "format") {
    format = words[1];
    version = words[2];
  } else {
    return Status(Status::INVALID_PARAMETER, "Missing or wrong format line");
  }
  if (version != "1.0") {
    return Status(Status::UNSUPPORTED_VERSION, "Unsupported PLY version");
  }
  if (format == "binary_big_endian") {
    return Status(Status::UNSUPPORTED_VERSION,
                  "Unsupported format. Currently we support only ascii and"
                  " binary_little_endian format.");
  }
  if (format == "ascii") {
    format_ = kAscii;
  } else {
    format_ = kLittleEndian;
  }
  DRACO_RETURN_IF_ERROR(ParseHeader(buffer));
  if (!ParsePropertiesData(buffer)) {
    return Status(Status::INVALID_PARAMETER, "Couldn't parse properties");
  }
  return OkStatus();
}